

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O2

ParseNodeProg * __thiscall
Js::ScriptContext::ParseScript
          (ScriptContext *this,Parser *parser,byte *script,size_t cb,SRCINFO *pSrcInfo,
          CompileScriptException *pse,Utf8SourceInfo **ppSourceInfo,char16 *rootDisplayName,
          LoadScriptFlag loadScriptFlag,uint *sourceIndex,Var scriptSource)

{
  SourceContextInfo *sourceContextInfo;
  Utf8SourceInfo *sourceInfo;
  ULONG grfsrc;
  int iVar1;
  uint uVar2;
  LPCUTF8 pSrc;
  size_t length;
  ParseNodeProg *pPVar3;
  ParseNodeProg *local_38;
  ParseNodeProg *parseTree;
  
  if (pSrcInfo == (SRCINFO *)0x0) {
    pSrcInfo = (((this->super_ScriptContextBase).javascriptLibrary)->cache).
               noContextGlobalSourceInfo.ptr;
  }
  MakeUtf8SourceInfo(this,script,cb,pSrcInfo,ppSourceInfo,loadScriptFlag,scriptSource);
  sourceContextInfo = (pSrcInfo->sourceContextInfo).ptr;
  grfsrc = GetParseFlags(this,loadScriptFlag,*ppSourceInfo,sourceContextInfo);
  if ((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None) {
    pSrc = Utf8SourceInfo::GetSource(*ppSourceInfo,(char16 *)0x0);
    length = Utf8SourceInfo::GetCbLength(*ppSourceInfo,(char16 *)0x0);
    iVar1 = Parser::ParseCesu8Source
                      (parser,&local_38,pSrc,length,grfsrc,pse,
                       &sourceContextInfo->nextLocalFunctionId,sourceContextInfo);
  }
  else {
    iVar1 = Parser::ParseUtf8Source
                      (parser,&local_38,script,cb,grfsrc,pse,&sourceContextInfo->nextLocalFunctionId
                       ,sourceContextInfo);
  }
  pPVar3 = (ParseNodeProg *)0x0;
  if ((-1 < iVar1) && (local_38 != (ParseNodeProg *)0x0)) {
    sourceInfo = *ppSourceInfo;
    sourceInfo->parseFlags = grfsrc;
    if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_None) {
      sourceInfo->m_cchLength = parser->m_sourceLim;
    }
    uVar2 = SaveSourceNoCopy(this,sourceInfo,loadScriptFlag,
                             (loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_None);
    *sourceIndex = uVar2;
    pPVar3 = local_38;
  }
  return pPVar3;
}

Assistant:

ParseNodeProg * ScriptContext::ParseScript(Parser* parser,
        const byte* script,
        size_t cb,
        SRCINFO const * pSrcInfo,
        CompileScriptException * pse,
        Utf8SourceInfo** ppSourceInfo,
        const char16 *rootDisplayName,
        LoadScriptFlag loadScriptFlag,
        uint* sourceIndex,
        Js::Var scriptSource)
    {
        if (pSrcInfo == nullptr)
        {
            pSrcInfo = this->Cache()->noContextGlobalSourceInfo;
        }

        MakeUtf8SourceInfo(script, cb, pSrcInfo, ppSourceInfo, loadScriptFlag, scriptSource);

        //
        // Parse and the JavaScript code
        //
        HRESULT hr;
        SourceContextInfo * sourceContextInfo = pSrcInfo->sourceContextInfo;

        // Invoke the parser, passing in the global function name, which we will then run to execute
        // the script.
        ULONG grfscr = GetParseFlags(loadScriptFlag, *ppSourceInfo, sourceContextInfo);

        ParseNodeProg * parseTree;
        if((loadScriptFlag & LoadScriptFlag_Utf8Source) == LoadScriptFlag_Utf8Source)
        {
            hr = parser->ParseUtf8Source(&parseTree, script, cb, grfscr, pse,
                &sourceContextInfo->nextLocalFunctionId, sourceContextInfo);
        }
        else
        {
            hr = parser->ParseCesu8Source(&parseTree, (*ppSourceInfo)->GetSource(), (*ppSourceInfo)->GetCbLength(), grfscr,
                pse, &sourceContextInfo->nextLocalFunctionId, sourceContextInfo);
        }

        if(FAILED(hr) || parseTree == nullptr)
        {
            return nullptr;
        }

        (*ppSourceInfo)->SetParseFlags(grfscr);

        //Make sure we have the body and text information available
        if ((loadScriptFlag & LoadScriptFlag_Utf8Source) != LoadScriptFlag_Utf8Source)
        {
            *sourceIndex = this->SaveSourceNoCopy(*ppSourceInfo, static_cast<charcount_t>((*ppSourceInfo)->GetCchLength()), /*isCesu8*/ true);
        }
        else
        {
            // Update the length.
            (*ppSourceInfo)->SetCchLength(parser->GetSourceIchLim());
            *sourceIndex = this->SaveSourceNoCopy(*ppSourceInfo, parser->GetSourceIchLim(), /* isCesu8*/ false);
        }

        return parseTree;
    }